

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

void asl::printf_(char *fmt,...)

{
  uint uVar1;
  char in_AL;
  uint uVar2;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar3;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar4;
  ulong __maxlen;
  bool bVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  char buffer [1000];
  undefined8 local_4e8;
  void **local_4e0;
  undefined1 *local_4d8;
  undefined1 local_4c8 [8];
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  char local_418 [1000];
  
  local_4d8 = local_4c8;
  if (in_AL != '\0') {
    local_498 = in_XMM0_Qa;
    local_488 = in_XMM1_Qa;
    local_478 = in_XMM2_Qa;
    local_468 = in_XMM3_Qa;
    local_458 = in_XMM4_Qa;
    local_448 = in_XMM5_Qa;
    local_438 = in_XMM6_Qa;
    local_428 = in_XMM7_Qa;
  }
  local_4e0 = &arg[0].overflow_arg_area;
  local_4e8 = 0x3000000008;
  __s = local_418;
  local_4c0 = in_RSI;
  local_4b8 = in_RDX;
  local_4b0 = in_RCX;
  local_4a8 = in_R8;
  local_4a0 = in_R9;
  uVar2 = vsnprintf(__s,1000,fmt,&local_4e8);
  if (uVar2 == 0xffffffff || 1000 < (int)uVar2) {
    __maxlen = 1000;
    __s = local_418;
    iVar3 = 8;
    do {
      uVar4 = (uint)__maxlen;
      if (1000 < uVar4) {
        operator_delete__(__s);
      }
      uVar1 = uVar4 * 2;
      __maxlen = (ulong)uVar1;
      __s = (char *)operator_new__((long)(int)uVar1);
      uVar2 = vsnprintf(__s,__maxlen,fmt,&local_4e8);
      bVar5 = iVar3 != 0;
      iVar3 = iVar3 + -1;
    } while ((uVar2 == 0xffffffff ||
              uVar2 != uVar1 && SBORROW4(uVar2,uVar1) == (int)(uVar2 + uVar4 * -2) < 0) && (bVar5));
    bVar5 = 1000 < uVar1;
  }
  else {
    bVar5 = false;
  }
  fwrite(__s,(long)(int)uVar2,1,_stdout);
  if (bVar5) {
    operator_delete__(__s);
  }
  return;
}

Assistant:

void printf_(const char* fmt, ...)
{
	const int N = 1000;
	char    buffer[N];
	char* str = buffer;
	va_list arg;
	va_start(arg, fmt);
	int i=0, n=0;
	int space = N;
	while(((n=vsnprintf(str, space, fmt, arg)) == -1 || n > space) && ++i < 10)
	{
		if (space > N)
			delete [] str;
		space *= 2;
		str = new char[space];
	}
	va_end(arg);
	fwrite(str, n, 1, stdout);
	if (space > N)
		delete [] str;
}